

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

uint32_t roaring_bitmap_minimum(roaring_bitmap_t *bm)

{
  ulong uVar1;
  long lVar2;
  uint32_t uVar3;
  undefined2 uVar4;
  int *piVar5;
  uint8_t uVar6;
  ulong *puVar7;
  long lVar8;
  
  if ((bm->high_low_container).size < 1) {
    uVar3 = 0xffffffff;
  }
  else {
    piVar5 = (int *)*(bm->high_low_container).containers;
    uVar6 = *(bm->high_low_container).typecodes;
    if (uVar6 == '\x04') {
      uVar6 = (uint8_t)piVar5[2];
      if (uVar6 == '\x04') {
        __assert_fail("*type != SHARED_CONTAINER_TYPE",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                      ,0x1062,
                      "const container_t *container_unwrap_shared(const container_t *, uint8_t *)");
      }
      piVar5 = *(int **)piVar5;
    }
    if ((uVar6 == '\x03') || (uVar6 == '\x02')) {
      if (*piVar5 == 0) {
        uVar4 = 0;
      }
      else {
        uVar4 = **(undefined2 **)(piVar5 + 2);
      }
    }
    else {
      if (uVar6 != '\x01') {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                      ,0x18d8,"uint16_t container_minimum(const container_t *, uint8_t)");
      }
      puVar7 = *(ulong **)(piVar5 + 2);
      lVar8 = 0;
      do {
        uVar1 = *puVar7;
        lVar2 = 0;
        if (uVar1 != 0) {
          for (; (uVar1 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
          }
        }
        piVar5 = (int *)((ulong)piVar5 & 0xffffffff);
        if (uVar1 != 0) {
          piVar5 = (int *)(ulong)(uint)((int)lVar2 + (int)lVar8);
        }
        uVar4 = SUB82(piVar5,0);
        if (uVar1 != 0) goto LAB_0011cb1d;
        lVar8 = lVar8 + 0x40;
        puVar7 = puVar7 + 1;
      } while (lVar8 != 0x10000);
      uVar4 = 0xffff;
    }
LAB_0011cb1d:
    uVar3 = CONCAT22(*(bm->high_low_container).keys,uVar4);
  }
  return uVar3;
}

Assistant:

uint32_t roaring_bitmap_minimum(const roaring_bitmap_t *bm) {
    if (bm->high_low_container.size > 0) {
        container_t *c = bm->high_low_container.containers[0];
        uint8_t type = bm->high_low_container.typecodes[0];
        uint32_t key = bm->high_low_container.keys[0];
        uint32_t lowvalue = container_minimum(c, type);
        return lowvalue | (key << 16);
    }
    return UINT32_MAX;
}